

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::accessChainGetInferredType(Builder *this)

{
  bool bVar1;
  uint member;
  Id IVar2;
  reference puVar3;
  size_type sVar4;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
  local_30;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
  local_28;
  const_iterator it;
  Id type;
  Builder *this_local;
  
  if ((this->accessChain).base == 0) {
    this_local._4_4_ = 0;
  }
  else {
    it._M_current._4_4_ = getTypeId(this,(this->accessChain).base);
    if (((this->accessChain).isRValue & 1U) == 0) {
      it._M_current._4_4_ = getContainedTypeId(this,it._M_current._4_4_);
    }
    local_28._M_current =
         (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::cbegin
                           (&(this->accessChain).indexChain);
    while( true ) {
      local_30._M_current =
           (uint *)std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::cend
                             (&(this->accessChain).indexChain);
      bVar1 = __gnu_cxx::operator!=(&local_28,&local_30);
      if (!bVar1) break;
      bVar1 = isStructType(this,it._M_current._4_4_);
      IVar2 = it._M_current._4_4_;
      if (bVar1) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
                 ::operator*(&local_28);
        member = getConstantScalar(this,*puVar3);
        it._M_current._4_4_ = getContainedTypeId(this,IVar2,member);
      }
      else {
        it._M_current._4_4_ = getContainedTypeId(this,it._M_current._4_4_);
      }
      __gnu_cxx::
      __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>_>
      ::operator++(&local_28);
    }
    sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                      (&(this->accessChain).swizzle);
    if (sVar4 == 1) {
      it._M_current._4_4_ = getContainedTypeId(this,it._M_current._4_4_);
    }
    else {
      sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                        (&(this->accessChain).swizzle);
      if (1 < sVar4) {
        IVar2 = getContainedTypeId(this,it._M_current._4_4_);
        sVar4 = std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::size
                          (&(this->accessChain).swizzle);
        it._M_current._4_4_ = makeVectorType(this,IVar2,(int)sVar4);
      }
    }
    if ((this->accessChain).component != 0) {
      it._M_current._4_4_ = getContainedTypeId(this,it._M_current._4_4_);
    }
    this_local._4_4_ = it._M_current._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

Id Builder::accessChainGetInferredType()
{
    // anything to operate on?
    if (accessChain.base == NoResult)
        return NoType;
    Id type = getTypeId(accessChain.base);

    // do initial dereference
    if (! accessChain.isRValue)
        type = getContainedTypeId(type);

    // dereference each index
    for (auto it = accessChain.indexChain.cbegin(); it != accessChain.indexChain.cend(); ++it) {
        if (isStructType(type))
            type = getContainedTypeId(type, getConstantScalar(*it));
        else
            type = getContainedTypeId(type);
    }

    // dereference swizzle
    if (accessChain.swizzle.size() == 1)
        type = getContainedTypeId(type);
    else if (accessChain.swizzle.size() > 1)
        type = makeVectorType(getContainedTypeId(type), (int)accessChain.swizzle.size());

    // dereference component selection
    if (accessChain.component)
        type = getContainedTypeId(type);

    return type;
}